

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

vrna_md_t * vrna_md_copy(vrna_md_t *md_to,vrna_md_t *md_from)

{
  vrna_md_t *local_28;
  vrna_md_t *md;
  int i;
  vrna_md_t *md_from_local;
  vrna_md_t *md_to_local;
  
  local_28 = (vrna_md_t *)0x0;
  if (md_from != (vrna_md_t *)0x0) {
    local_28 = md_to;
    if (md_to == (vrna_md_t *)0x0) {
      local_28 = (vrna_md_t *)vrna_alloc(0x7e8);
    }
    if (md_to != md_from) {
      memcpy(local_28,md_from,0x7e8);
      *(undefined8 *)local_28->rtype = *(undefined8 *)md_from->rtype;
      *(undefined8 *)(local_28->rtype + 2) = *(undefined8 *)(md_from->rtype + 2);
      *(undefined8 *)(local_28->rtype + 4) = *(undefined8 *)(md_from->rtype + 4);
      *(undefined8 *)(local_28->rtype + 6) = *(undefined8 *)(md_from->rtype + 6);
      memcpy(local_28->alias,md_from->alias,0x2a);
      memcpy(local_28->nonstandards,md_from->nonstandards,0x40);
      for (md._4_4_ = 0; md._4_4_ < 0x15; md._4_4_ = md._4_4_ + 1) {
        memcpy(local_28->pair + md._4_4_,md_from->pair + md._4_4_,0x54);
      }
    }
  }
  return local_28;
}

Assistant:

PUBLIC vrna_md_t *
vrna_md_copy(vrna_md_t        *md_to,
             const vrna_md_t  *md_from)
{
  int       i;
  vrna_md_t *md;

  md = NULL;

  /* only process if md_from is non-NULL */
  if (md_from) {
    if (!md_to)
      /* create container to be filled */
      md = (vrna_md_t *)vrna_alloc(sizeof(vrna_md_t));
    else
      /* or directly write to target */
      md = md_to;

    /* check if not the same object */
    if (md_to != md_from) {
      /* copy simple members */
      memcpy(md, md_from, sizeof(vrna_md_t));
      /* copy arrays */
      memcpy(md->rtype, &(md_from->rtype[0]), 8 * sizeof(int));
      memcpy(md->alias, &(md_from->alias[0]), (MAXALPHA + 1) * sizeof(short));
      memcpy(md->nonstandards, &(md_from->nonstandards[0]), 64 * sizeof(char));
      /* copy matrices */
      for (i = 0; i <= MAXALPHA; i++)
        memcpy(md->pair[i], (md_from->pair[i]), (MAXALPHA + 1) * sizeof(int));
    }
  }

  return md;
}